

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator(cmNinjaNormalTargetGenerator *this)

{
  cmOSXBundleGenerator *pcVar1;
  
  (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_00686e00;
  pcVar1 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
  if (pcVar1 != (cmOSXBundleGenerator *)0x0) {
    std::__cxx11::string::~string((string *)&pcVar1->ConfigName);
  }
  operator_delete(pcVar1,0x40);
  std::__cxx11::string::~string((string *)&this->TargetLinkLanguage);
  std::__cxx11::string::~string((string *)&this->TargetNamePDB);
  std::__cxx11::string::~string((string *)&this->TargetNameImport);
  std::__cxx11::string::~string((string *)&this->TargetNameReal);
  std::__cxx11::string::~string((string *)&this->TargetNameSO);
  std::__cxx11::string::~string((string *)&this->TargetNameOut);
  cmNinjaTargetGenerator::~cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator);
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator()
{
  delete this->OSXBundleGenerator;
}